

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseReportField(OptionParser *this,Network *network,int nTokens,string *tokens)

{
  bool bVar1;
  InputError *pIVar2;
  string *psVar3;
  string local_1d8 [39];
  undefined1 local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  undefined1 local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  undefined1 local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [35];
  undefined1 local_75;
  string local_68 [32];
  double local_48;
  double upperLimit;
  double lowerLimit;
  int precision;
  int enabled;
  int index;
  int type;
  string *tokens_local;
  Network *pNStack_18;
  int nTokens_local;
  Network *network_local;
  OptionParser *this_local;
  
  enabled = 0;
  precision = -1;
  lowerLimit._4_4_ = -1;
  lowerLimit._0_4_ = -1;
  upperLimit = -1.0;
  local_48 = -1.0;
  _index = tokens;
  tokens_local._4_4_ = nTokens;
  pNStack_18 = network;
  network_local = (Network *)this;
  precision = Utilities::findMatch(tokens,ReportFields::NodeFieldNames);
  if (precision < 0) {
    enabled = 1;
    precision = Utilities::findMatch(_index,ReportFields::LinkFieldNames);
    if (precision < 0) {
      local_75 = 1;
      pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_68,(string *)_index);
      InputError::InputError(pIVar2,3,(string *)local_68);
      local_75 = 0;
      __cxa_throw(pIVar2,&InputError::typeinfo,InputError::~InputError);
    }
  }
  psVar3 = _index + 0x20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"YES",&local_99);
  bVar1 = Utilities::match(psVar3,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (bVar1) {
    lowerLimit._4_4_ = 1;
  }
  else {
    psVar3 = _index + 0x20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"NO",&local_c1);
    bVar1 = Utilities::match(psVar3,(string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (bVar1) {
      lowerLimit._4_4_ = 0;
    }
    else {
      if (tokens_local._4_4_ < 3) {
        return;
      }
      psVar3 = _index + 0x20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"PRECISION",&local_e9);
      bVar1 = Utilities::match(psVar3,(string *)local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      if (bVar1) {
        bVar1 = Utilities::parseNumber<int>(_index + 0x40,(int *)&lowerLimit);
        if (!bVar1) {
          local_111 = 1;
          pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_110,(string *)(_index + 0x40));
          InputError::InputError(pIVar2,6,(string *)local_110);
          local_111 = 0;
          __cxa_throw(pIVar2,&InputError::typeinfo,InputError::~InputError);
        }
      }
      else {
        psVar3 = _index + 0x20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_138,"BELOW",&local_139);
        bVar1 = Utilities::match(psVar3,(string *)local_138);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
        if (bVar1) {
          bVar1 = Utilities::parseNumber<double>(_index + 0x40,&upperLimit);
          if (!bVar1) {
            local_161 = 1;
            pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_160,(string *)(_index + 0x40));
            InputError::InputError(pIVar2,6,(string *)local_160);
            local_161 = 0;
            __cxa_throw(pIVar2,&InputError::typeinfo,InputError::~InputError);
          }
        }
        else {
          psVar3 = _index + 0x20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_188,"ABOVE",&local_189);
          bVar1 = Utilities::match(psVar3,(string *)local_188);
          std::__cxx11::string::~string(local_188);
          std::allocator<char>::~allocator((allocator<char> *)&local_189);
          if (!bVar1) {
            pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_1d8,(string *)(_index + 0x20));
            InputError::InputError(pIVar2,3,(string *)local_1d8);
            __cxa_throw(pIVar2,&InputError::typeinfo,InputError::~InputError);
          }
          bVar1 = Utilities::parseNumber<double>(_index + 0x40,&local_48);
          if (!bVar1) {
            local_1b1 = 1;
            pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_1b0,(string *)(_index + 0x40));
            InputError::InputError(pIVar2,6,(string *)local_1b0);
            local_1b1 = 0;
            __cxa_throw(pIVar2,&InputError::typeinfo,InputError::~InputError);
          }
        }
      }
    }
  }
  Options::setReportFieldOption
            (&pNStack_18->options,enabled,precision,lowerLimit._4_4_,lowerLimit._0_4_,upperLimit,
             local_48);
  return;
}

Assistant:

void OptionParser::parseReportField(Network* network, int nTokens, string* tokens)
{
    int    type = Element::NODE;
    int    index = -1;
    int    enabled = -1;
    int    precision = -1;
    double lowerLimit = -1;
    double upperLimit = -1;

    // ... parse FieldName  YES/NO
    index = Utilities::findMatch(tokens[0], ReportFields::NodeFieldNames);
    if ( index < 0 )
    {
        type = Element::LINK;
        index = Utilities::findMatch(tokens[0], ReportFields::LinkFieldNames);
        if ( index < 0 ) throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
    }

    if ( Utilities::match(tokens[1], "YES") ) enabled = 1;
    else if ( Utilities::match(tokens[1], "NO") ) enabled = 0;
    else if ( nTokens < 3 ) return;

    // ... parse FieldName  PRECISION  number
    else if ( Utilities::match(tokens[1], "PRECISION") )
    {
        if ( !Utilities::parseNumber(tokens[2], precision) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }

    // ... parse FieldName  ABOVE/BELOW  number
    else if ( Utilities::match(tokens[1], "BELOW") )
    {
        if ( !Utilities::parseNumber(tokens[2], lowerLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else if ( Utilities::match(tokens[1], "ABOVE") )
    {
        if ( !Utilities::parseNumber(tokens[2], upperLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);

    network->options.setReportFieldOption(
            type, index, enabled, precision, lowerLimit, upperLimit);
}